

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
handle_query_item(char *key,size_t keyLen,char *value,size_t valueLen,curi_settings *settings,
                 void *userData)

{
  char *output;
  char *urlDecodedKey;
  size_t urlDecodedKeyLen;
  size_t keyAllocationSize;
  void *pvStack_38;
  curi_status status;
  void *userData_local;
  curi_settings *settings_local;
  size_t valueLen_local;
  char *value_local;
  size_t keyLen_local;
  char *key_local;
  
  keyAllocationSize._4_4_ = curi_status_success;
  if ((keyLen != 0) &&
     ((((settings->query_item_null_callback != (_func_int_void_ptr_char_ptr_size_t *)0x0 ||
        (settings->query_item_int_callback != (_func_int_void_ptr_char_ptr_size_t_long *)0x0)) ||
       (settings->query_item_double_callback != (_func_int_void_ptr_char_ptr_size_t_double *)0x0))
      || (settings->query_item_str_callback !=
          (_func_int_void_ptr_char_ptr_size_t_char_ptr_size_t *)0x0)))) {
    pvStack_38 = userData;
    userData_local = settings;
    settings_local = (curi_settings *)valueLen;
    valueLen_local = (size_t)value;
    value_local = (char *)keyLen;
    keyLen_local = (size_t)key;
    if (settings->url_decode == 0) {
      keyAllocationSize._4_4_ =
           handle_query_item_decodedKey(key,keyLen,value,valueLen,settings,userData);
    }
    else {
      urlDecodedKeyLen = keyLen + 1;
      output = (char *)(*settings->allocate)(userData,urlDecodedKeyLen);
      keyAllocationSize._4_4_ =
           curi_url_decode((char *)keyLen_local,(size_t)value_local,output,(size_t)(value_local + 1)
                           ,(size_t *)&urlDecodedKey);
      if (keyAllocationSize._4_4_ == curi_status_success) {
        keyAllocationSize._4_4_ =
             handle_query_item_decodedKey
                       (output,(size_t)urlDecodedKey,(char *)valueLen_local,(size_t)settings_local,
                        (curi_settings *)userData_local,pvStack_38);
      }
      (**(code **)((long)userData_local + 8))(pvStack_38,output,urlDecodedKeyLen);
    }
  }
  return keyAllocationSize._4_4_;
}

Assistant:

static curi_status handle_query_item(const char* key, size_t keyLen, const char* value, size_t valueLen, const curi_settings* settings, void* userData)
{
    curi_status status = curi_status_success;
    if (keyLen > 0 && (settings->query_item_null_callback || settings->query_item_int_callback || settings->query_item_double_callback || settings->query_item_str_callback))
    {
        if (settings->url_decode == 0)
        {
            status = handle_query_item_decodedKey(key, keyLen, value, valueLen, settings, userData);
        }
        else
        {
            size_t keyAllocationSize = (keyLen+1) * sizeof(char);
            size_t urlDecodedKeyLen;
            char* urlDecodedKey = (char*)settings->allocate(userData, keyAllocationSize);

            status = curi_url_decode(key, keyLen, urlDecodedKey, keyLen+1, &urlDecodedKeyLen);

            if (status == curi_status_success)
                status = handle_query_item_decodedKey(urlDecodedKey, urlDecodedKeyLen, value, valueLen, settings, userData);

            settings->deallocate(userData, urlDecodedKey, keyAllocationSize);
        }
    }
    return status;
}